

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O3

bool jessilib::equalsi<char8_t,char16_t>
               (basic_string_view<char8_t,_std::char_traits<char8_t>_> lhs,
               basic_string_view<char16_t,_std::char_traits<char16_t>_> rhs)

{
  int iVar1;
  int iVar2;
  char16_t *pcVar3;
  uint uVar4;
  char8_t *pcVar5;
  char8_t *extraout_RDX;
  char8_t *pcVar7;
  wchar32 wVar8;
  long lVar9;
  jessilib *this;
  char8_t *pcVar10;
  decode_result dVar11;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string;
  char8_t *pcVar6;
  
  pcVar10 = lhs._M_str;
  this = (jessilib *)lhs._M_len;
  pcVar3 = rhs._M_str;
  pcVar7 = (char8_t *)rhs._M_len;
  pcVar6 = pcVar7;
  while( true ) {
    if (this == (jessilib *)0x0) {
      return pcVar7 == (char8_t *)0x0;
    }
    if (pcVar7 == (char8_t *)0x0) break;
    in_string._M_str = pcVar6;
    in_string._M_len = (size_t)pcVar10;
    dVar11 = decode_codepoint_utf8<char8_t>(this,in_string);
    pcVar5 = (char8_t *)dVar11.units;
    wVar8 = (wchar32)(ushort)*pcVar3;
    lVar9 = 1;
    pcVar6 = pcVar5;
    if ((pcVar7 != (char8_t *)0x1) && ((wVar8 & 0xfc00U) == 0xd800)) {
      uVar4 = (ushort)pcVar3[1] & 0xfc00;
      pcVar6 = (char8_t *)(ulong)uVar4;
      if (uVar4 == 0xdc00) {
        wVar8 = (uint)(ushort)*pcVar3 * 0x400 + (uint)(ushort)pcVar3[1] + L'\xfca02400';
        lVar9 = 2;
      }
    }
    if (pcVar5 == (char8_t *)0x0) {
      return false;
    }
    if (dVar11.codepoint != wVar8) {
      iVar1 = jessilib::fold(dVar11.codepoint);
      iVar2 = jessilib::fold(wVar8);
      pcVar6 = extraout_RDX;
      if (iVar1 != iVar2) {
        return false;
      }
    }
    pcVar10 = pcVar10 + (long)pcVar5;
    pcVar7 = pcVar7 + -lVar9;
    pcVar3 = pcVar3 + lVar9;
    this = this + -(long)pcVar5;
  }
  return false;
}

Assistant:

bool equalsi(std::basic_string_view<LhsCharT> lhs, std::basic_string_view<RhsCharT> rhs) {
	// If lhs and rhs are the same type, compare their sizes and quickly return if not same
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (lhs.size() != rhs.size()) {
			return false;
		}
	}

	while (!lhs.empty() && !rhs.empty()) {
		auto lhs_front = decode_codepoint(lhs);
		auto rhs_front = decode_codepoint(rhs);

		if (lhs_front.units == 0
			|| rhs_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return false;
		}

		if (!equalsi(lhs_front.codepoint, rhs_front.codepoint)) {
			// Codepoints don't fold to same value
			return false;
		}

		// Codepoints are equal; trim off the fronts and continue
		lhs.remove_prefix(lhs_front.units);
		rhs.remove_prefix(rhs_front.units);
	}

	return lhs.empty() && rhs.empty();
}